

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O1

int testSpanTestsIterationStaticSlices(void)

{
  bool bVar1;
  StaticSliceIterator<2UL> SVar2;
  ostream *poVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>_>
  IVar7;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  Span<const_int,_18446744073709551615UL> span;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> local_60;
  pointer local_48;
  long lStack_40;
  undefined8 local_38;
  
  local_48 = (pointer)0x200000001;
  lStack_40 = 0x400000003;
  local_38 = 0x600000005;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,&local_61);
  local_48 = (pointer)0x0;
  if ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_48 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  lStack_40 = (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  IVar7 = MILBlob::Util::Span<int_const,18446744073709551615ul>::IterateSlices<2ul>
                    ((Span<int_const,18446744073709551615ul> *)&local_48);
  SVar2 = IVar7.m_begin.m_ptr;
  uVar5 = 0;
  bVar6 = SVar2.m_ptr == IVar7.m_end.m_ptr.m_ptr;
  if (!bVar6) {
    do {
      if (*SVar2.m_ptr == uVar5 + 1) {
        bVar1 = true;
        uVar4 = uVar5 + 2;
        if (SVar2.m_ptr[1] != uVar5 + 2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                     ,0x71);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x250);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"(row.Get<1>()) == (counter + 2)",0x1f);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          goto LAB_001ce457;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x71);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x24f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"(row.Get<0>()) == (counter + 1)",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
LAB_001ce457:
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        bVar1 = false;
        uVar4 = uVar5;
      }
      if (!bVar1) break;
      SVar2.m_ptr = SVar2.m_ptr + 2;
      bVar6 = SVar2.m_ptr == IVar7.m_end.m_ptr.m_ptr;
      uVar5 = uVar4;
    } while (!bVar6);
    uVar5 = (uint)(uVar4 == 6);
  }
  uVar4 = (uint)(bVar6 ^ 1U);
  if (((char)uVar5 == '\0') && ((bVar6 ^ 1U) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x254);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(counter) == (6)",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    uVar4 = 1;
    std::ostream::flush();
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar4;
}

Assistant:

int testSpanTestsIterationStaticSlices()
{
    const std::vector<int> values = {1, 2, 3, 4, 5, 6};
    auto span = MakeSpan(values);

    // iterate 3 values at a time
    int counter = 0;
    for (auto row : span.IterateSlices<2>()) {
        ML_ASSERT_EQ(row.Size(), size_t(2));
        ML_ASSERT_EQ(row.Get<0>(), counter + 1);
        ML_ASSERT_EQ(row.Get<1>(), counter + 2);

        counter += 2;
    }
    ML_ASSERT_EQ(counter, 6);

    return 0;
}